

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O1

int spng_get_ihdr(spng_ctx *ctx,spng_ihdr *ihdr)

{
  uint32_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  undefined3 uVar7;
  int iVar8;
  
  if (ctx != (spng_ctx *)0x0) {
    iVar8 = read_chunks(ctx,1);
    if ((iVar8 == 0) && (iVar8 = 1, ihdr != (spng_ihdr *)0x0)) {
      uVar1 = (ctx->ihdr).height;
      uVar2 = (ctx->ihdr).bit_depth;
      uVar3 = (ctx->ihdr).color_type;
      uVar4 = (ctx->ihdr).compression_method;
      uVar5 = (ctx->ihdr).filter_method;
      uVar6 = (ctx->ihdr).interlace_method;
      uVar7 = *(undefined3 *)&(ctx->ihdr).field_0xd;
      ihdr->width = (ctx->ihdr).width;
      ihdr->height = uVar1;
      ihdr->bit_depth = uVar2;
      ihdr->color_type = uVar3;
      ihdr->compression_method = uVar4;
      ihdr->filter_method = uVar5;
      ihdr->interlace_method = uVar6;
      *(undefined3 *)&ihdr->field_0xd = uVar7;
      iVar8 = 0;
    }
    return iVar8;
  }
  return 1;
}

Assistant:

int spng_get_ihdr(spng_ctx *ctx, struct spng_ihdr *ihdr)
{
    if(ctx == NULL) return 1;
    int ret = read_chunks(ctx, 1);
    if(ret) return ret;
    if(ihdr == NULL) return 1;

    *ihdr = ctx->ihdr;

    return 0;
}